

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_pmul_b_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = uVar1 + 8;
  uVar3 = (ulong)uVar2;
  uVar5 = 0;
  do {
    uVar4 = *(ulong *)((long)vn + uVar5 * 8);
    uVar8 = *(ulong *)((long)vm + uVar5 * 8);
    lVar6 = 8;
    uVar7 = 0;
    do {
      uVar7 = uVar7 ^ (uVar4 & 0x101010101010101) * 0xff & uVar8;
      uVar8 = uVar8 * 2 & 0xfefefefefefefefe;
      uVar4 = uVar4 >> 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    *(ulong *)((long)vd + uVar5 * 8) = uVar7;
    uVar5 = uVar5 + 1;
  } while (uVar5 != uVar2 >> 3);
  uVar2 = desc >> 2 & 0xf8;
  if (uVar1 < uVar2) {
    uVar4 = (ulong)(uVar2 + 8);
    uVar5 = uVar3 + 8;
    if (uVar3 + 8 < uVar4) {
      uVar5 = uVar4;
    }
    memset((void *)((long)vd + uVar3),0,(~uVar3 + uVar5 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_pmul_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = n[i];
        uint64_t mm = m[i];
        uint64_t rr = 0;

        for (j = 0; j < 8; ++j) {
            uint64_t mask = (nn & 0x0101010101010101ull) * 0xff;
            rr ^= mm & mask;
            mm = (mm << 1) & 0xfefefefefefefefeull;
            nn >>= 1;
        }
        d[i] = rr;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}